

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

Matrix * TRM::lookAt(Matrix *__return_storage_ptr__,Vec3f eye,Vec3f center,Vec3f up)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  vec<3,_float,_(glm::qualifier)0> local_38;
  vec<3,_float,_(glm::qualifier)0> local_28;
  undefined8 local_18;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_10;
  
  local_38.field_2 = up.field_2;
  local_38._0_8_ = up._0_8_;
  local_28.field_2 = center.field_2;
  local_28._0_8_ = center._0_8_;
  local_10 = eye.field_2;
  local_18 = eye._0_8_;
  glm::lookAtRH<float,(glm::qualifier)0>
            (__return_storage_ptr__,(glm *)&local_18,&local_28,&local_38,in_R8);
  return __return_storage_ptr__;
}

Assistant:

Matrix lookAt(Vec3f eye, Vec3f center, Vec3f up) {
  return glm::lookAt(eye, center, up);
}